

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
          (rule *this,unsigned_long *args)

{
  context *pcVar1;
  error_code eVar2;
  unique_ptr<pstore::exchange::import_ns::uint64_rule,_std::default_delete<pstore::exchange::import_ns::uint64_rule>_>
  local_38;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_30;
  unsigned_long *local_28;
  unsigned_long *args_local;
  rule *this_local;
  error_category *local_10;
  
  local_28 = args;
  args_local = (unsigned_long *)this;
  pcVar1 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->(&this->context_);
  std::
  make_unique<pstore::exchange::import_ns::uint64_rule,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,unsigned_long*&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_38,
             (unsigned_long **)&this->context_);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::uint64_rule,std::default_delete<pstore::exchange::import_ns::uint64_rule>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_30,&local_38);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::push(&pcVar1->stack,(value_type *)&local_30);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_30);
  std::
  unique_ptr<pstore::exchange::import_ns::uint64_rule,_std::default_delete<pstore::exchange::import_ns::uint64_rule>_>
  ::~unique_ptr(&local_38);
  log_top(this,true);
  std::error_code::error_code((error_code *)&this_local);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }